

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ConcurrentQueue
          (ConcurrentQueue<_zframe_t_*,_MyTraits> *this,size_t minCapacity,
          size_t maxExplicitProducers,size_t maxImplicitProducers)

{
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_RCX;
  atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ProducerBase_*> *in_RDI;
  size_t blocks;
  memory_order __b;
  __integral_type __i;
  __integral_type_conflict __i_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  array<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducerKVP,_32UL>
  *in_stack_ffffffffffffffb0;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *pCVar2;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *this_00;
  
  uVar1 = 0;
  __i = 0;
  std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ProducerBase_*>::atomic
            (in_RDI,(__pointer_type)0x0);
  std::atomic<unsigned_int>::atomic
            ((atomic<unsigned_int> *)in_RDI,(__integral_type_conflict)(__i >> 0x20));
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,__i);
  __i_00 = (__integral_type_conflict)(__i >> 0x20);
  FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block>::FreeList
            ((FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block> *)0x1cf8b5);
  std::array<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducerKVP,_32UL>::array
            (in_stack_ffffffffffffffb0);
  pCVar2 = (ConcurrentQueue<_zframe_t_*,_MyTraits> *)(in_RDI + 0x4b);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)in_RDI,__i_00);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)in_RDI,__i_00);
  this_00 = pCVar2;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(undefined1 *)&(pCVar2->producerListTail)._M_b._M_p = 0;
  populate_initial_implicit_producer_hash(in_RCX);
  populate_initial_block_list(this_00,CONCAT44(uVar1,in_stack_ffffffffffffffa8));
  return;
}

Assistant:

ConcurrentQueue(size_t minCapacity, size_t maxExplicitProducers, size_t maxImplicitProducers)
		: producerListTail(nullptr),
		producerCount(0),
		initialBlockPoolIndex(0),
		nextExplicitConsumerId(0),
		globalExplicitConsumerOffset(0)
	{
		implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
		populate_initial_implicit_producer_hash();
		size_t blocks = (((minCapacity + BLOCK_SIZE - 1) / BLOCK_SIZE) - 1) * (maxExplicitProducers + 1) + 2 * (maxExplicitProducers + maxImplicitProducers);
		populate_initial_block_list(blocks);
		
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
		explicitProducers.store(nullptr, std::memory_order_relaxed);
		implicitProducers.store(nullptr, std::memory_order_relaxed);
#endif
	}